

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O1

void tvm::runtime::ImportModuleBlob
               (char *mblob,
               vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *mlist)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Any_data *p_Var3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  byte *pbVar7;
  size_t nbytes;
  ulong uVar8;
  string tkey;
  uint64_t size;
  string fkey;
  TVMValue_conflict values [1];
  Module m;
  MemoryFixedSizeStream fs;
  uint64_t sz;
  undefined4 local_25c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ulong local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *local_210;
  TVMRetValue local_208;
  MemoryFixedSizeStream *local_1f8;
  TVMRetValue *local_1f0;
  value_type local_1e8;
  MemoryFixedSizeStream local_1d8;
  undefined1 local_1b8 [16];
  undefined4 local_1a8;
  
  local_210 = mlist;
  if (mblob == (char *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Check failed: mblob != nullptr",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
  }
  lVar6 = 0;
  local_1d8.buffer_size_ = 0;
  pbVar7 = (byte *)mblob;
  do {
    local_1d8.buffer_size_ = local_1d8.buffer_size_ | (ulong)*pbVar7 << ((byte)lVar6 & 0x3f);
    lVar6 = lVar6 + 8;
    pbVar7 = pbVar7 + 1;
  } while (lVar6 != 0x40);
  local_1d8.p_buffer_ = mblob + 8;
  local_1d8.super_SeekStream.super_Stream._vptr_Stream = (Stream)&PTR_Read_00149620;
  local_1d8.curr_ptr_ = 0;
  sVar2 = dmlc::MemoryFixedSizeStream::Read(&local_1d8,&local_238,8);
  if (sVar2 != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Check failed: stream->Read(&size)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
  }
  if (local_238 != 0) {
    uVar8 = 0;
    do {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      iVar1 = (**(_func_int **)local_1d8.super_SeekStream.super_Stream._vptr_Stream)
                        (&local_1d8,(LogMessageFatal *)local_1b8,8);
      uVar5 = local_1b8._0_8_;
      if (CONCAT44(extraout_var,iVar1) == 8) {
        std::__cxx11::string::resize((ulong)&local_258,(char)local_1b8._0_8_);
        if ((MemoryFixedSizeStream **)local_1b8._0_8_ != (MemoryFixedSizeStream **)0x0) {
          iVar1 = (**(_func_int **)local_1d8.super_SeekStream.super_Stream._vptr_Stream)
                            (&local_1d8,local_258._M_dataplus._M_p,uVar5);
          if ((MemoryFixedSizeStream **)CONCAT44(extraout_var_00,iVar1) !=
              (MemoryFixedSizeStream **)uVar5) goto LAB_0010923d;
        }
      }
      else {
LAB_0010923d:
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                   ,0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"Check failed: stream->Read(&tkey)",0x21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      std::operator+(&local_230,"module.loadbinary_",&local_258);
      p_Var3 = (_Any_data *)Registry::Get(&local_230);
      if (p_Var3 == (_Any_data *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                   ,0x37);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"Check failed: f != nullptr",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Loader of ",10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,local_258._M_dataplus._M_p,
                            local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") is not presented.",0x13);
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
      }
      local_1f8 = &local_1d8;
      local_25c = 3;
      local_208.super_TVMPODValue_.type_code_ = 4;
      local_1b8._0_8_ = &local_1f8;
      local_1b8._8_8_ = &local_25c;
      local_1a8 = 1;
      local_1f0 = &local_208;
      if (*(long *)(p_Var3 + 1) == 0) {
        uVar5 = std::__throw_bad_function_call();
        dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
        _Unwind_Resume(uVar5);
      }
      (**(code **)((long)p_Var3 + 0x18))(p_Var3,(TVMArgs *)local_1b8,&local_1f0);
      TVMRetValue::operator_cast_to_Module((TVMRetValue *)&local_1e8);
      TVMRetValue::Clear(&local_208);
      std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>::push_back
                (local_210,&local_1e8);
      if (local_1e8.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e8.node_.
                   super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < local_238);
  }
  return;
}

Assistant:

void ImportModuleBlob(const char *mblob, std::vector<Module> *mlist) {
#ifndef _LIBCPP_SGX_CONFIG
  CHECK(mblob != nullptr);
  uint64_t nbytes = 0;
  for (size_t i = 0; i < sizeof(nbytes); ++i) {
    uint64_t c = mblob[i];
    nbytes |= (c & 0xffUL) << (i * 8);
  }
  dmlc::MemoryFixedSizeStream fs(
      const_cast<char *>(mblob + sizeof(nbytes)), static_cast<size_t>(nbytes));
  dmlc::Stream *stream = &fs;
  uint64_t size;
  CHECK(stream->Read(&size));
  for (uint64_t i = 0; i < size; ++i) {
    std::string tkey;
    CHECK(stream->Read(&tkey));
    std::string fkey = "module.loadbinary_" + tkey;
    const PackedFunc *f = Registry::Get(fkey);
    CHECK(f != nullptr)
        << "Loader of " << tkey << "("
        << fkey << ") is not presented.";
    Module m = (*f)(static_cast<void *>(stream));
    mlist->push_back(m);
  }
#else
  LOG(FATAL) << "SGX does not support ImportModuleBlob";
#endif
}